

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getblock_request.cc
# Opt level: O0

int __thiscall GetblockRequest::Write(GetblockRequest *this,ByteBuffer *buffer)

{
  NamenodeRequest *in_RSI;
  ByteBuffer *in_RDI;
  ByteBuffer *unaff_retaddr;
  
  NamenodeRequest::Write(in_RSI,in_RDI);
  crail::ByteBuffer::PutLong(unaff_retaddr,(longlong)in_RDI);
  crail::ByteBuffer::PutLong(unaff_retaddr,(longlong)in_RDI);
  crail::ByteBuffer::PutLong(unaff_retaddr,(longlong)in_RDI);
  crail::ByteBuffer::PutLong(unaff_retaddr,(longlong)in_RDI);
  return 0;
}

Assistant:

int GetblockRequest::Write(ByteBuffer &buffer) {
  NamenodeRequest::Write(buffer);

  buffer.PutLong(fd_);
  buffer.PutLong(token_);
  buffer.PutLong(position_);
  buffer.PutLong(capacity_);

  return 0;
}